

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O0

void __thiscall libsgp4::Tle::ExtractExponential(Tle *this,string *str,double *val)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  TleException *pTVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70 [3];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  const_iterator i;
  string temp;
  double *val_local;
  string *str_local;
  Tle *this_local;
  
  std::__cxx11::string::string((string *)&i);
  local_48._M_current = (char *)std::__cxx11::string::begin();
  do {
    local_50._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
    if (!bVar1) {
      bVar1 = Util::FromString<double>((string *)&i,val);
      if (bVar1) {
        std::__cxx11::string::~string((string *)&i);
        return;
      }
      pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
      TleException::TleException(pTVar4,"Failed to convert value to double");
      __cxa_throw(pTVar4,&TleException::typeinfo,TleException::~TleException);
    }
    local_58._M_current = (char *)std::__cxx11::string::begin();
    bVar1 = __gnu_cxx::operator==(&local_48,&local_58);
    if (bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_48);
      if (((*pcVar3 != '-') &&
          (pcVar3 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&local_48), *pcVar3 != '+')) &&
         (pcVar3 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_48), *pcVar3 != ' ')) {
        pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
        TleException::TleException(pTVar4,"Invalid sign");
        __cxa_throw(pTVar4,&TleException::typeinfo,TleException::~TleException);
      }
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_48);
      if (*pcVar3 == '-') {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_48);
        std::__cxx11::string::operator+=((string *)&i,*pcVar3);
      }
      std::__cxx11::string::operator+=((string *)&i,'0');
      std::__cxx11::string::operator+=((string *)&i,'.');
    }
    else {
      local_78._M_current = (char *)std::__cxx11::string::end();
      local_70[0] = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator-(&local_78,2);
      bVar1 = __gnu_cxx::operator==(&local_48,local_70);
      if (bVar1) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_48);
        if ((*pcVar3 != '-') &&
           (pcVar3 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_48), *pcVar3 != '+')) {
          pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(pTVar4,"Invalid exponential sign");
          __cxa_throw(pTVar4,&TleException::typeinfo,TleException::~TleException);
        }
        std::__cxx11::string::operator+=((string *)&i,'e');
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_48);
        std::__cxx11::string::operator+=((string *)&i,*pcVar3);
      }
      else {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_48);
        iVar2 = isdigit((int)*pcVar3);
        if (iVar2 == 0) {
          pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(pTVar4,"Invalid digit");
          __cxa_throw(pTVar4,&TleException::typeinfo,TleException::~TleException);
        }
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_48);
        std::__cxx11::string::operator+=((string *)&i,*pcVar3);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_48);
  } while( true );
}

Assistant:

void Tle::ExtractExponential(const std::string& str, double& val)
{
    std::string temp;

    for (std::string::const_iterator i = str.begin(); i != str.end(); ++i)
    {
        if (i == str.begin())
        {
            if (*i == '-' || *i == '+' || *i == ' ')
            {
                if (*i == '-')
                {
                    temp += *i;
                }
                temp += '0';
                temp += '.';
            }
            else
            {
                throw TleException("Invalid sign");
            }
        }
        else if (i == str.end() - 2)
        {
            if (*i == '-' || *i == '+')
            {
                temp += 'e';
                temp += *i;
            }
            else
            {
                throw TleException("Invalid exponential sign");
            }
        }
        else
        {
            if (isdigit(*i))
            {
                temp += *i;
            }
            else
            {
                throw TleException("Invalid digit");
            }
        }
    }

    if (!Util::FromString<double>(temp, val))
    {
        throw TleException("Failed to convert value to double");
    }
}